

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Node * __thiscall llvm::yaml::KeyValueNode::getKey(KeyValueNode *this)

{
  TokenKind TVar1;
  Token *pTVar2;
  Node *this_00;
  Token TStack_48;
  
  if (this->Key != (Node *)0x0) {
    return this->Key;
  }
  pTVar2 = Node::peekNext(&this->super_Node);
  TVar1 = pTVar2->Kind;
  if (((TVar1 != TK_Error) && (TVar1 != TK_BlockEnd)) && (TVar1 != TK_Value)) {
    if (TVar1 == TK_Key) {
      Node::getNext(&TStack_48,&this->super_Node);
      std::__cxx11::string::_M_dispose();
    }
    pTVar2 = Node::peekNext(&this->super_Node);
    if ((pTVar2->Kind != TK_Value) && (pTVar2->Kind != TK_BlockEnd)) {
      this_00 = Node::parseBlockNode(&this->super_Node);
      goto LAB_00175bfd;
    }
  }
  this_00 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                              (&((((this->super_Node).Doc)->_M_t).
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->NodeAllocator,0x48,0x10);
  NullNode::NullNode((NullNode *)this_00,(this->super_Node).Doc);
LAB_00175bfd:
  this->Key = this_00;
  return this_00;
}

Assistant:

Node *KeyValueNode::getKey() {
  if (Key)
    return Key;
  // Handle implicit null keys.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_Value
        || t.Kind == Token::TK_Error) {
      return Key = new (getAllocator()) NullNode(Doc);
    }
    if (t.Kind == Token::TK_Key)
      getNext(); // skip TK_Key.
  }

  // Handle explicit null keys.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Value) {
    return Key = new (getAllocator()) NullNode(Doc);
  }

  // We've got a normal key.
  return Key = parseBlockNode();
}